

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::SplitNDLayerParams::InternalSwap
          (SplitNDLayerParams *this,SplitNDLayerParams *other)

{
  intptr_t iVar1;
  void *pvVar2;
  void *pvVar3;
  int64_t iVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  LogMessage *other_00;
  LogFinisher local_51;
  LogMessage local_50;
  
  iVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  (this->super_MessageLite)._internal_metadata_.ptr_ =
       (other->super_MessageLite)._internal_metadata_.ptr_;
  (other->super_MessageLite)._internal_metadata_.ptr_ = iVar1;
  if (this == other) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x324);
    other_00 = google::protobuf::internal::LogMessage::operator<<
                         (&local_50,"CHECK failed: this != other: ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other_00);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  iVar8 = (this->splitsizes_).current_size_;
  iVar9 = (this->splitsizes_).total_size_;
  pvVar2 = (this->splitsizes_).arena_or_elements_;
  iVar7 = (other->splitsizes_).total_size_;
  pvVar3 = (other->splitsizes_).arena_or_elements_;
  (this->splitsizes_).current_size_ = (other->splitsizes_).current_size_;
  (this->splitsizes_).total_size_ = iVar7;
  (this->splitsizes_).arena_or_elements_ = pvVar3;
  (other->splitsizes_).current_size_ = iVar8;
  (other->splitsizes_).total_size_ = iVar9;
  (other->splitsizes_).arena_or_elements_ = pvVar2;
  iVar4 = this->axis_;
  uVar5 = this->numsplits_;
  uVar6 = other->numsplits_;
  this->axis_ = other->axis_;
  this->numsplits_ = uVar6;
  other->axis_ = iVar4;
  other->numsplits_ = uVar5;
  return;
}

Assistant:

void SplitNDLayerParams::InternalSwap(SplitNDLayerParams* other) {
  using std::swap;
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  splitsizes_.InternalSwap(&other->splitsizes_);
  ::PROTOBUF_NAMESPACE_ID::internal::memswap<
      PROTOBUF_FIELD_OFFSET(SplitNDLayerParams, numsplits_)
      + sizeof(SplitNDLayerParams::numsplits_)
      - PROTOBUF_FIELD_OFFSET(SplitNDLayerParams, axis_)>(
          reinterpret_cast<char*>(&axis_),
          reinterpret_cast<char*>(&other->axis_));
}